

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_disks.cpp
# Opt level: O2

int benchmark_disks(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  allocator local_29e;
  allocator local_29d;
  uint batch_size;
  string local_298;
  external_size_type block_size;
  external_size_type offset;
  external_size_type size;
  string allocstr;
  string optrw;
  Logger local_220;
  CmdlineParser cp;
  
  tlx::CmdlineParser::CmdlineParser(&cp);
  size = 0;
  offset = 0;
  batch_size = 0;
  block_size = 0x800000;
  std::__cxx11::string::string((string *)&optrw,"rw",(allocator *)&local_220);
  allocstr._M_dataplus._M_p = (pointer)&allocstr.field_2;
  allocstr._M_string_length = 0;
  allocstr.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_220,"quiet",&local_29d);
  std::__cxx11::string::string((string *)&local_298,"quiet processing",&local_29e);
  tlx::CmdlineParser::add_flag(&cp,'q',(string *)&local_220,&g_quiet,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"size",&local_29d);
  std::__cxx11::string::string
            ((string *)&local_298,"Amount of data to write/read from disks (e.g. 10GiB)",&local_29e)
  ;
  tlx::CmdlineParser::add_param_bytes(&cp,(string *)&local_220,&size,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"r|w",&local_29d);
  std::__cxx11::string::string
            ((string *)&local_298,"Only read or write blocks (default: both write and read)",
             &local_29e);
  tlx::CmdlineParser::add_opt_param_string(&cp,(string *)&local_220,&optrw,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"alloc",&local_29d);
  std::__cxx11::string::string
            ((string *)&local_298,
             "Block allocation strategy: random_cyclic, simple_random, fully_random, striping. (default: random_cyclic)"
             ,&local_29e);
  tlx::CmdlineParser::add_opt_param_string(&cp,(string *)&local_220,&allocstr,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"batch",&local_29d);
  std::__cxx11::string::string
            ((string *)&local_298,"Number of blocks written/read in one batch (default: D * B)",
             &local_29e);
  tlx::CmdlineParser::add_unsigned(&cp,'b',(string *)&local_220,&batch_size,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"block_size",&local_29d);
  std::__cxx11::string::string
            ((string *)&local_298,"Size of blocks written in one syscall. (default: B = 8MiB)",
             &local_29e);
  tlx::CmdlineParser::add_bytes(&cp,'B',(string *)&local_220,&block_size,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"offset",&local_29d);
  std::__cxx11::string::string
            ((string *)&local_298,"Starting offset of operation range. (default: 0)",&local_29e);
  tlx::CmdlineParser::add_bytes(&cp,'o',(string *)&local_220,&offset,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_220,"time-limit",&local_29d);
  std::__cxx11::string::string((string *)&local_298,"limit time of experiment (seconds)",&local_29e)
  ;
  tlx::CmdlineParser::add_double(&cp,'T',(string *)&local_220,&g_time_limit,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string
            ((string *)&local_220,
             "This program will benchmark the disks configured by the standard .foxxll disk configuration files mechanism. Blocks of 8 MiB are written and/or read in sequence using the block manager. The batch size describes how many blocks are written/read in one batch. The are taken from block_manager using given the specified allocation strategy. If size == 0, then writing/reading operation are done until an error occurs. "
             ,(allocator *)&local_298);
  tlx::CmdlineParser::set_description(&cp,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = tlx::CmdlineParser::process(&cp,argc,argv);
  iVar2 = -1;
  if (bVar1) {
    if ((allocstr._M_string_length == 0) ||
       (bVar1 = std::operator==(&allocstr,"random_cyclic"), bVar1)) {
      iVar2 = benchmark_disks_alloc<foxxll::random_cyclic>
                        (size,offset,(ulong)batch_size,block_size,&optrw);
    }
    else {
      bVar1 = std::operator==(&allocstr,"simple_random");
      if (bVar1) {
        iVar2 = benchmark_disks_alloc<foxxll::simple_random>
                          (size,offset,(ulong)batch_size,block_size,&optrw);
      }
      else {
        bVar1 = std::operator==(&allocstr,"fully_random");
        if (bVar1) {
          iVar2 = benchmark_disks_alloc<foxxll::fully_random>
                            (size,offset,(ulong)batch_size,block_size,&optrw);
        }
        else {
          bVar1 = std::operator==(&allocstr,"striping");
          if (bVar1) {
            iVar2 = benchmark_disks_alloc<foxxll::striping>
                              (size,offset,(ulong)batch_size,block_size,&optrw);
          }
          else {
            tlx::Logger::Logger(&local_220);
            std::operator<<((ostream *)&local_220,"Unknown allocation strategy \'");
            std::operator<<((ostream *)&local_220,(string *)&allocstr);
            std::operator<<((ostream *)&local_220,"\'");
            tlx::Logger::~Logger(&local_220);
            tlx::CmdlineParser::print_usage(&cp);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&allocstr);
  std::__cxx11::string::~string((string *)&optrw);
  tlx::CmdlineParser::~CmdlineParser(&cp);
  return iVar2;
}

Assistant:

int benchmark_disks(int argc, char* argv[])
{
    // parse command line

    tlx::CmdlineParser cp;

    external_size_type size = 0, offset = 0;
    unsigned int batch_size = 0;
    external_size_type block_size = 8 * MiB;
    std::string optrw = "rw", allocstr;

    cp.add_flag(
        'q', "quiet", g_quiet, "quiet processing"
    );

    cp.add_param_bytes(
        "size", size,
        "Amount of data to write/read from disks (e.g. 10GiB)"
    );
    cp.add_opt_param_string(
        "r|w", optrw,
        "Only read or write blocks (default: both write and read)"
    );
    cp.add_opt_param_string(
        "alloc", allocstr,
        "Block allocation strategy: random_cyclic, simple_random, fully_random, striping. (default: random_cyclic)"
    );

    cp.add_unsigned(
        'b', "batch", batch_size,
        "Number of blocks written/read in one batch (default: D * B)"
    );
    cp.add_bytes(
        'B', "block_size", block_size,
        "Size of blocks written in one syscall. (default: B = 8MiB)"
    );
    cp.add_bytes(
        'o', "offset", offset,
        "Starting offset of operation range. (default: 0)"
    );
    cp.add_double(
        'T', "time-limit", g_time_limit,
        "limit time of experiment (seconds)"
    );

    cp.set_description(
        "This program will benchmark the disks configured by the standard "
        ".foxxll disk configuration files mechanism. Blocks of 8 MiB are "
        "written and/or read in sequence using the block manager. The batch "
        "size describes how many blocks are written/read in one batch. The "
        "are taken from block_manager using given the specified allocation "
        "strategy. If size == 0, then writing/reading operation are done "
        "until an error occurs. "
    );

    if (!cp.process(argc, argv))
        return -1;

    if (allocstr.size())
    {
        if (allocstr == "random_cyclic")
            return benchmark_disks_alloc<foxxll::random_cyclic>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "simple_random")
            return benchmark_disks_alloc<foxxll::simple_random>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "fully_random")
            return benchmark_disks_alloc<foxxll::fully_random>(
                size, offset, batch_size, block_size, optrw
            );
        if (allocstr == "striping")
            return benchmark_disks_alloc<foxxll::striping>(
                size, offset, batch_size, block_size, optrw
            );

        LOG1 << "Unknown allocation strategy '" << allocstr << "'";
        cp.print_usage();
        return -1;
    }

    return benchmark_disks_alloc<foxxll::default_alloc_strategy>(
        size, offset, batch_size, block_size, optrw
    );
}